

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O0

bool __thiscall UniValue::pushKV(UniValue *this,string *key,UniValue *val_)

{
  bool bVar1;
  UniValue *in_stack_ffffffffffffffb8;
  UniValue *this_00;
  size_type local_30;
  size_t idx;
  UniValue *val__local;
  string *key_local;
  UniValue *this_local;
  
  if (this->typ == VOBJ) {
    idx = (size_t)val_;
    val__local = (UniValue *)key;
    key_local = (string *)this;
    bVar1 = findKey(this,key,&local_30);
    if (bVar1) {
      this_00 = (UniValue *)idx;
      std::vector<UniValue,_std::allocator<UniValue>_>::operator[](&this->values,local_30);
      operator=(this_00,in_stack_ffffffffffffffb8);
    }
    else {
      __pushKV(this,(string *)val__local,(UniValue *)idx);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool UniValue::pushKV(const std::string& key, const UniValue& val_)
{
    if (typ != VOBJ)
        return false;

    size_t idx;
    if (findKey(key, idx))
        values[idx] = val_;
    else
        __pushKV(key, val_);
    return true;
}